

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GLES2ThreadTest::Surface::Surface(Surface *this,SharedPtr<tcu::ThreadUtil::Event> *event)

{
  SharedPtr<tcu::ThreadUtil::Event> local_28;
  SharedPtr<tcu::ThreadUtil::Event> *local_18;
  SharedPtr<tcu::ThreadUtil::Event> *event_local;
  Surface *this_local;
  
  local_18 = event;
  event_local = (SharedPtr<tcu::ThreadUtil::Event> *)this;
  de::SharedPtr<tcu::ThreadUtil::Event>::SharedPtr(&local_28,event);
  tcu::ThreadUtil::Object::Object(&this->super_Object,"Surface",&local_28);
  de::SharedPtr<tcu::ThreadUtil::Event>::~SharedPtr(&local_28);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__Surface_03267428;
  this->surface = (EGLSurface)0x0;
  return;
}

Assistant:

Surface::Surface (SharedPtr<tcu::ThreadUtil::Event> event)
	: tcu::ThreadUtil::Object	("Surface", event)
	, surface					(EGL_NO_SURFACE)
{
}